

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O1

ostream * operator<<(ostream *os,linkedList<char_*> *rhs)

{
  l_node<char_*> *plVar1;
  char *__s;
  size_t sVar2;
  
  if (rhs->size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"EMPTY LIST\n",0xb);
  }
  for (plVar1 = rhs->head; plVar1 != (l_node<char_*> *)0x0; plVar1 = plVar1->next) {
    __s = plVar1->data;
    if (__s == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
    }
    if (plVar1->next != (l_node<char_*> *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const linkedList<T>& rhs)
{
    if (rhs.isEmpty()){
        os << "EMPTY LIST\n";

    }
    for (l_node<T> *temp = rhs.head; temp != nullptr; temp = temp->next)
    {
        os << temp->data;
        if (temp->next != nullptr)
            os << ", ";
    }
//    os<<"\n";
    return os;
}